

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O2

int enet_socket_receive(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,
                       size_t bufferCount)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  sockaddr_in sin;
  msghdr msgHdr;
  
  msgHdr.msg_name = (void *)0x0;
  msgHdr.msg_namelen = 0;
  msgHdr._12_4_ = 0;
  msgHdr.msg_control = (void *)0x0;
  msgHdr.msg_controllen = 0;
  msgHdr.msg_flags = 0;
  msgHdr._52_4_ = 0;
  if (address != (ENetAddress *)0x0) {
    msgHdr.msg_namelen = 0x10;
    msgHdr._12_4_ = 0;
    msgHdr.msg_name = &sin;
  }
  msgHdr.msg_iov = (iovec *)buffers;
  msgHdr.msg_iovlen = bufferCount;
  sVar2 = recvmsg(socket,(msghdr *)&msgHdr,0x4000);
  iVar1 = (int)sVar2;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar4 = -(uint)(*piVar3 != 0xb);
  }
  else {
    iVar4 = -1;
    if ((msgHdr._48_8_ & 0x20) == 0) {
      iVar4 = iVar1;
    }
    if (address != (ENetAddress *)0x0 && (msgHdr._48_8_ & 0x20) == 0) {
      address->host = sin.sin_addr.s_addr;
      address->port = sin.sin_port << 8 | sin.sin_port >> 8;
      iVar4 = iVar1;
    }
  }
  return iVar4;
}

Assistant:

int
enet_socket_receive (ENetSocket socket,
                     ENetAddress * address,
                     ENetBuffer * buffers,
                     size_t bufferCount)
{
    struct msghdr msgHdr;
    struct sockaddr_in sin;
    int recvLength;

    memset (& msgHdr, 0, sizeof (struct msghdr));

    if (address != NULL)
    {
        msgHdr.msg_name = & sin;
        msgHdr.msg_namelen = sizeof (struct sockaddr_in);
    }

    msgHdr.msg_iov = (struct iovec *) buffers;
    msgHdr.msg_iovlen = bufferCount;

    recvLength = recvmsg (socket, & msgHdr, MSG_NOSIGNAL);

    if (recvLength == -1)
    {
       if (errno == EWOULDBLOCK)
         return 0;

       return -1;
    }

#ifdef HAS_MSGHDR_FLAGS
    if (msgHdr.msg_flags & MSG_TRUNC)
      return -1;
#endif

    if (address != NULL)
    {
        address -> host = (enet_uint32) sin.sin_addr.s_addr;
        address -> port = ENET_NET_TO_HOST_16 (sin.sin_port);
    }

    return recvLength;
}